

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall MobileElement::~MobileElement(MobileElement *this)

{
  this->_vptr_MobileElement = (_func_int **)&PTR___cxa_pure_virtual_0019d610;
  std::__cxx11::string::~string((string *)&this->gene_bound_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<MobileElement>)._M_weak_this.
              super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

MobileElement::~MobileElement(){}